

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float x0;
  float y0;
  ImVec2 IVar1;
  char cVar2;
  ushort uVar3;
  ImFont *pIVar4;
  ImFont **ppIVar5;
  bool bVar6;
  int iVar7;
  ImFontAtlasCustomRect *pIVar8;
  long lVar9;
  int y;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  long lVar15;
  ImVec2 local_40;
  ImVec2 local_38;
  
  lVar9 = (long)atlas->CustomRectIds[0];
  if (lVar9 < 0) {
    __assert_fail("atlas->CustomRectIds[0] >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x8d1,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x8d2,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->CustomRects).Size <= atlas->CustomRectIds[0]) {
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                  ,0x52e,
                  "T &ImVector<ImFontAtlasCustomRect>::operator[](int) [T = ImFontAtlasCustomRect]")
    ;
  }
  pIVar8 = (atlas->CustomRects).Data;
  uVar12 = (uint)pIVar8[lVar9].X;
  if (uVar12 == 0xffff) {
    __assert_fail("r.IsPacked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x8d4,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  pIVar8 = pIVar8 + lVar9;
  iVar7 = atlas->TexWidth;
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar8->Width != 0xd9) || (pIVar8->Height != 0x1b)) {
      __assert_fail("r.Width == FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF * 2 + 1 && r.Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0x8da,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar10 = 0;
    lVar9 = 0;
    do {
      lVar13 = 0;
      do {
        cVar2 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                [(int)lVar9 + lVar13];
        lVar15 = (long)(int)((uint)pIVar8->X + (int)lVar13 + ((uint)pIVar8->Y + iVar10) * iVar7);
        atlas->TexPixelsAlpha8[lVar15] = -(cVar2 == '.');
        atlas->TexPixelsAlpha8[lVar15 + 0x6d] = -(cVar2 == 'X');
        lVar13 = lVar13 + 1;
      } while ((int)lVar13 != 0x6c);
      iVar10 = iVar10 + 1;
      lVar9 = (int)lVar9 + lVar13;
    } while (iVar10 != 0x1b);
  }
  else {
    if ((pIVar8->Width != 2) || (pIVar8->Height != 2)) {
      __assert_fail("r.Width == 2 && r.Height == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0x8e6,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar10 = (uint)pIVar8->Y * iVar7 + uVar12;
    atlas->TexPixelsAlpha8[(long)(iVar7 + iVar10) + 1] = 0xff;
    atlas->TexPixelsAlpha8[iVar7 + iVar10] = 0xff;
    atlas->TexPixelsAlpha8[(long)iVar10 + 1] = 0xff;
    atlas->TexPixelsAlpha8[iVar10] = 0xff;
  }
  uVar12._0_2_ = pIVar8->X;
  uVar12._2_2_ = pIVar8->Y;
  IVar1 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar1.x * ((float)(uVar12 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar1.y * ((float)(uVar12 >> 0x10) + 0.5);
  iVar7 = (atlas->CustomRects).Size;
  if (0 < iVar7) {
    lVar13 = 0;
    lVar9 = 0;
    do {
      pIVar8 = (atlas->CustomRects).Data;
      lVar15 = *(long *)((long)&pIVar8->Font + lVar13);
      if ((lVar15 != 0) && (*(int *)((long)&pIVar8->GlyphID + lVar13) != 0)) {
        if (*(ImFontAtlas **)(lVar15 + 0x48) != atlas) {
          __assert_fail("r.Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                        ,0x8f9,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        local_38.x = 0.0;
        local_38.y = 0.0;
        local_40.x = 0.0;
        local_40.y = 0.0;
        ImFontAtlas::CalcCustomRectUV
                  (atlas,(ImFontAtlasCustomRect *)((long)&pIVar8->Width + lVar13),&local_38,
                   &local_40);
        x0 = *(float *)((long)&(pIVar8->GlyphOffset).x + lVar13);
        y0 = *(float *)((long)&(pIVar8->GlyphOffset).y + lVar13);
        ImFont::AddGlyph(*(ImFont **)((long)&pIVar8->Font + lVar13),
                         *(ImWchar *)((long)&pIVar8->GlyphID + lVar13),x0,y0,
                         (float)*(ushort *)((long)&pIVar8->Width + lVar13) + x0,
                         (float)*(ushort *)((long)&pIVar8->Height + lVar13) + y0,local_38.x,
                         local_38.y,local_40.x,local_40.y,
                         *(float *)((long)&pIVar8->GlyphAdvanceX + lVar13));
        iVar7 = (atlas->CustomRects).Size;
      }
      lVar9 = lVar9 + 1;
      lVar13 = lVar13 + 0x20;
    } while (lVar9 < iVar7);
  }
  uVar12 = (atlas->Fonts).Size;
  if (0 < (int)uVar12) {
    lVar9 = 0;
    do {
      pIVar4 = (atlas->Fonts).Data[lVar9];
      if (pIVar4->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar4);
        uVar12 = (atlas->Fonts).Size;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)uVar12);
    if (0 < (int)uVar12) {
      ppIVar5 = (atlas->Fonts).Data;
      uVar11 = 0;
      do {
        pIVar4 = ppIVar5[uVar11];
        if (pIVar4->EllipsisChar == 0xffff) {
          lVar9 = 0;
          bVar6 = true;
          do {
            bVar14 = bVar6;
            uVar3 = (&DAT_00191d84)[lVar9];
            if ((((ulong)uVar3 < (ulong)(long)(pIVar4->IndexLookup).Size) &&
                ((pIVar4->IndexLookup).Data[uVar3] != 0xffff)) &&
               ((pIVar4->Glyphs).Data != (ImFontGlyph *)0x0)) {
              pIVar4->EllipsisChar = uVar3;
              break;
            }
            lVar9 = 1;
            bVar6 = false;
          } while (bVar14);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar12);
    }
  }
  return;
}

Assistant:

static void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->CustomRectIds[0] >= 0);
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL);
    ImFontAtlasCustomRect& r = atlas->CustomRects[atlas->CustomRectIds[0]];
    IM_ASSERT(r.IsPacked());

    const int w = atlas->TexWidth;
    if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
    {
        // Render/copy pixels
        IM_ASSERT(r.Width == FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF * 2 + 1 && r.Height == FONT_ATLAS_DEFAULT_TEX_DATA_H);
        for (int y = 0, n = 0; y < FONT_ATLAS_DEFAULT_TEX_DATA_H; y++)
            for (int x = 0; x < FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF; x++, n++)
            {
                const int offset0 = (int)(r.X + x) + (int)(r.Y + y) * w;
                const int offset1 = offset0 + FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
                atlas->TexPixelsAlpha8[offset0] = FONT_ATLAS_DEFAULT_TEX_DATA_PIXELS[n] == '.' ? 0xFF : 0x00;
                atlas->TexPixelsAlpha8[offset1] = FONT_ATLAS_DEFAULT_TEX_DATA_PIXELS[n] == 'X' ? 0xFF : 0x00;
            }
    }
    else
    {
        IM_ASSERT(r.Width == 2 && r.Height == 2);
        const int offset = (int)(r.X) + (int)(r.Y) * w;
        atlas->TexPixelsAlpha8[offset] = atlas->TexPixelsAlpha8[offset + 1] = atlas->TexPixelsAlpha8[offset + w] = atlas->TexPixelsAlpha8[offset + w + 1] = 0xFF;
    }
    atlas->TexUvWhitePixel = ImVec2((r.X + 0.5f) * atlas->TexUvScale.x, (r.Y + 0.5f) * atlas->TexUvScale.y);
}